

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  char *__s;
  RenderContext *pRVar4;
  DataType dataType;
  DataType dataType_00;
  DataType DVar5;
  undefined8 in_R9;
  undefined1 *in_stack_ffffffffffffd518;
  bool local_2a71;
  bool local_2819;
  string local_1cb0;
  undefined1 local_1c90 [8];
  string shaderSource_110;
  undefined1 local_1c50 [8];
  string shaderSource_109;
  undefined1 local_1c10 [8];
  string shaderSource_108;
  string local_1be8;
  deUint32 local_1bc8;
  ContextType local_1bc4;
  string local_1bc0;
  undefined1 local_1ba0 [8];
  string shaderSource_107;
  undefined1 local_1b60 [8];
  string shaderSource_106;
  undefined1 local_1b20 [8];
  string shaderSource_105;
  undefined1 local_1ae0 [8];
  string shaderSource_104;
  undefined1 local_1aa0 [8];
  string shaderSource_103;
  undefined1 local_1a60 [8];
  string shaderSource_102;
  undefined1 local_1a20 [8];
  string shaderSource_101;
  undefined1 local_19e0 [8];
  string shaderSource_100;
  undefined1 local_19a0 [8];
  string shaderSource_99;
  undefined1 local_1960 [8];
  string shaderSource_98;
  undefined1 local_1920 [8];
  string shaderSource_97;
  undefined1 local_18e0 [8];
  string shaderSource_96;
  undefined1 local_18a0 [8];
  string shaderSource_95;
  undefined1 local_1860 [8];
  string shaderSource_94;
  undefined1 local_1820 [8];
  string shaderSource_93;
  undefined1 local_17e0 [8];
  string shaderSource_92;
  undefined1 local_17a0 [8];
  string shaderSource_91;
  undefined1 local_1760 [8];
  string shaderSource_90;
  string local_1738;
  deUint32 local_1718;
  ContextType local_1714;
  string local_1710;
  undefined1 local_16f0 [8];
  string shaderSource_89;
  undefined1 local_16b0 [8];
  string shaderSource_88;
  undefined1 local_1670 [8];
  string shaderSource_87;
  undefined1 local_1630 [8];
  string shaderSource_86;
  undefined1 local_15f0 [8];
  string shaderSource_85;
  undefined1 local_15b0 [8];
  string shaderSource_84;
  undefined1 local_1570 [8];
  string shaderSource_83;
  undefined1 local_1530 [8];
  string shaderSource_82;
  undefined1 local_14f0 [8];
  string shaderSource_81;
  undefined1 local_14b0 [8];
  string shaderSource_80;
  undefined1 local_1470 [8];
  string shaderSource_79;
  undefined1 local_1430 [8];
  string shaderSource_78;
  undefined1 local_13f0 [8];
  string shaderSource_77;
  undefined1 local_13b0 [8];
  string shaderSource_76;
  undefined1 local_1370 [8];
  string shaderSource_75;
  undefined1 local_1330 [8];
  string shaderSource_74;
  undefined1 local_12f0 [8];
  string shaderSource_73;
  undefined1 local_12b0 [8];
  string shaderSource_72;
  undefined1 local_1270 [8];
  string shaderSource_71;
  undefined1 local_1230 [8];
  string shaderSource_70;
  undefined1 local_11f0 [8];
  string shaderSource_69;
  undefined1 local_11b0 [8];
  string shaderSource_68;
  undefined1 local_1170 [8];
  string shaderSource_67;
  undefined1 local_1130 [8];
  string shaderSource_66;
  undefined1 local_10f0 [8];
  string shaderSource_65;
  undefined1 local_10b0 [8];
  string shaderSource_64;
  undefined1 local_1070 [8];
  string shaderSource_63;
  undefined1 local_1030 [8];
  string shaderSource_62;
  undefined1 local_ff0 [8];
  string shaderSource_61;
  undefined1 local_fb0 [8];
  string shaderSource_60;
  undefined1 local_f70 [8];
  string shaderSource_59;
  undefined1 local_f30 [8];
  string shaderSource_58;
  undefined1 local_ef0 [8];
  string shaderSource_57;
  undefined1 local_eb0 [8];
  string shaderSource_56;
  undefined1 local_e70 [8];
  string shaderSource_55;
  undefined1 local_e30 [8];
  string shaderSource_54;
  undefined1 local_df0 [8];
  string shaderSource_53;
  undefined1 local_db0 [8];
  string shaderSource_52;
  undefined1 local_d70 [8];
  string shaderSource_51;
  undefined1 local_d30 [8];
  string shaderSource_50;
  undefined1 local_cf0 [8];
  string shaderSource_49;
  undefined1 local_cb0 [8];
  string shaderSource_48;
  undefined1 local_c70 [8];
  string shaderSource_47;
  undefined1 local_c30 [8];
  string shaderSource_46;
  undefined1 local_bf0 [8];
  string shaderSource_45;
  undefined1 local_bb0 [8];
  string shaderSource_44;
  undefined1 local_b70 [8];
  string shaderSource_43;
  undefined1 local_b30 [8];
  string shaderSource_42;
  undefined1 local_af0 [8];
  string shaderSource_41;
  undefined1 local_ab0 [8];
  string shaderSource_40;
  undefined1 local_a70 [8];
  string shaderSource_39;
  undefined1 local_a30 [8];
  string shaderSource_38;
  undefined1 local_9f0 [8];
  string shaderSource_37;
  undefined1 local_9b0 [8];
  string shaderSource_36;
  undefined1 local_970 [8];
  string shaderSource_35;
  undefined1 local_930 [8];
  string shaderSource_34;
  undefined1 local_8f0 [8];
  string shaderSource_33;
  undefined1 local_8b0 [8];
  string shaderSource_32;
  undefined1 local_870 [8];
  string shaderSource_31;
  undefined1 local_830 [8];
  string shaderSource_30;
  undefined1 local_7f0 [8];
  string shaderSource_29;
  undefined1 local_7b0 [8];
  string shaderSource_28;
  undefined1 local_770 [8];
  string shaderSource_27;
  undefined1 local_730 [8];
  string shaderSource_26;
  undefined1 local_6f0 [8];
  string shaderSource_25;
  undefined1 local_6b0 [8];
  string shaderSource_24;
  undefined1 local_670 [8];
  string shaderSource_23;
  undefined1 local_630 [8];
  string shaderSource_22;
  undefined1 local_5f0 [8];
  string shaderSource_21;
  undefined1 local_5b0 [8];
  string shaderSource_20;
  undefined1 local_570 [8];
  string shaderSource_19;
  undefined1 local_530 [8];
  string shaderSource_18;
  undefined1 local_4f0 [8];
  string shaderSource_17;
  undefined1 local_4b0 [8];
  string shaderSource_16;
  undefined1 local_470 [8];
  string shaderSource_15;
  undefined1 local_430 [8];
  string shaderSource_14;
  undefined1 local_3f0 [8];
  string shaderSource_13;
  undefined1 local_3b0 [8];
  string shaderSource_12;
  undefined1 local_370 [8];
  string shaderSource_11;
  undefined1 local_330 [8];
  string shaderSource_10;
  undefined1 local_2f0 [8];
  string shaderSource_9;
  undefined1 local_2b0 [8];
  string shaderSource_8;
  undefined1 local_270 [8];
  string shaderSource_7;
  undefined1 local_230 [8];
  string shaderSource_6;
  undefined1 local_1f0 [8];
  string shaderSource_5;
  undefined1 local_1b0 [8];
  string shaderSource_4;
  undefined1 local_170 [8];
  string shaderSource_3;
  undefined1 local_130 [8];
  string shaderSource_2;
  undefined1 local_f0 [8];
  string shaderSource_1;
  undefined1 local_b0 [8];
  string shaderSource;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"texture: Invalid P type.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar3 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 ((anonymous_namespace)::s_shaders + (long)local_48 * 4));
    pNVar2 = local_10;
    if (bVar3) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataTypeNdx,__s,
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      std::operator+(&local_68,"Verify shader: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &dataTypeNdx);
      NegativeTestContext::beginSection(pNVar2,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&dataTypeNdx);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      for (shaderSource.field_2._8_4_ = 0; DVar5 = (DataType)in_R9,
          (int)shaderSource.field_2._8_4_ < 4;
          shaderSource.field_2._8_4_ = shaderSource.field_2._8_4_ + 1) {
        if (*(int *)((anonymous_namespace)::s_floatTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                    ) != 2) {
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x28,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_b0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x28,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_f0);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_130,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x35,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_130);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_130);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_170,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x35,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_4.field_2._M_local_buf + 8),(string *)local_170);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_4.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_170);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3c,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_5.field_2._M_local_buf + 8),(string *)local_1b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_5.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_5.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1b0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3c,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_6.field_2._M_local_buf + 8),(string *)local_1f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_6.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_6.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1f0);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_230,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x28,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_7.field_2._M_local_buf + 8),(string *)local_230);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_7.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_7.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_230);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_270,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x28,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_8.field_2._M_local_buf + 8),(string *)local_270);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_8.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_8.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_270);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_2b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x35,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_9.field_2._M_local_buf + 8),(string *)local_2b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_9.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_9.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_2b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_2f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x35,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_10.field_2._M_local_buf + 8),(string *)local_2f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_10.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_10.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_2f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_330,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3c,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_11.field_2._M_local_buf + 8),(string *)local_330);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_11.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_11.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_330);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_370,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3c,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_12.field_2._M_local_buf + 8),(string *)local_370);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_12.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_12.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_370);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_3b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x28,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_13.field_2._M_local_buf + 8),(string *)local_3b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_13.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_13.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_3b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_3f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x28,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_14.field_2._M_local_buf + 8),(string *)local_3f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_14.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_14.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_3f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_430,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x35,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_15.field_2._M_local_buf + 8),(string *)local_430);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_15.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_15.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_430);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_470,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x35,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_16.field_2._M_local_buf + 8),(string *)local_470);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_16.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_16.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_470);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_4b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3c,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_17.field_2._M_local_buf + 8),(string *)local_4b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_17.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_17.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_4b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_4f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3c,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_18.field_2._M_local_buf + 8),(string *)local_4f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_18.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_18.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_4f0);
        if (*(int *)((anonymous_namespace)::s_floatTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                    ) != 3) {
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_530,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2c,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_19.field_2._M_local_buf + 8),(string *)local_530);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_19.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_19.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_530);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_570,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2c,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_20.field_2._M_local_buf + 8),(string *)local_570);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_20.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_20.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_570);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_5b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x39,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_21.field_2._M_local_buf + 8),(string *)local_5b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_21.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_21.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_5b0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_5f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x39,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_22.field_2._M_local_buf + 8),(string *)local_5f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_22.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_22.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_5f0);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_630,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x40,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_23.field_2._M_local_buf + 8),(string *)local_630);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_23.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_23.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_630);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_670,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x40,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_24.field_2._M_local_buf + 8),(string *)local_670);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_24.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_24.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_670);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_6b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2c,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_25.field_2._M_local_buf + 8),(string *)local_6b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_25.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_25.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_6b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_6f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2c,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_26.field_2._M_local_buf + 8),(string *)local_6f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_26.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_26.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_6f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_730,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x39,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_27.field_2._M_local_buf + 8),(string *)local_730);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_27.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_27.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_730);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_770,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x39,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_28.field_2._M_local_buf + 8),(string *)local_770);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_28.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_28.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_770);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_7b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x40,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_29.field_2._M_local_buf + 8),(string *)local_7b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_29.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_29.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_7b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_7f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x40,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_30.field_2._M_local_buf + 8),(string *)local_7f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_30.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_30.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_7f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_830,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2c,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_31.field_2._M_local_buf + 8),(string *)local_830);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_31.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_31.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_830);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_870,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2c,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_32.field_2._M_local_buf + 8),(string *)local_870);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_32.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_32.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_870);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_8b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x39,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_33.field_2._M_local_buf + 8),(string *)local_8b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_33.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_33.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_8b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_8f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x39,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_34.field_2._M_local_buf + 8),(string *)local_8f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_34.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_34.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_8f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_930,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x40,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_35.field_2._M_local_buf + 8),(string *)local_930);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_35.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_35.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_930);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_970,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x40,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_36.field_2._M_local_buf + 8),(string *)local_970);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_36.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_36.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_970);
        if (*(int *)((anonymous_namespace)::s_floatTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                    ) != 3) {
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_9b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x29,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_37.field_2._M_local_buf + 8),(string *)local_9b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_37.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_37.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_9b0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_9f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x29,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_38.field_2._M_local_buf + 8),(string *)local_9f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_38.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_38.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_9f0);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_a30,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x36,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_39.field_2._M_local_buf + 8),(string *)local_a30);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_39.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_39.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_a30);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_a70,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x36,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_40.field_2._M_local_buf + 8),(string *)local_a70);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_40.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_40.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_a70);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_ab0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3d,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_41.field_2._M_local_buf + 8),(string *)local_ab0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_41.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_41.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_ab0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_af0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3d,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_42.field_2._M_local_buf + 8),(string *)local_af0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_42.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_42.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_af0);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_b30,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x29,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_43.field_2._M_local_buf + 8),(string *)local_b30);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_43.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_43.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_b30);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_b70,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x29,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_44.field_2._M_local_buf + 8),(string *)local_b70);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_44.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_44.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_b70);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_bb0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x36,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_45.field_2._M_local_buf + 8),(string *)local_bb0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_45.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_45.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_bb0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_bf0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x36,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_46.field_2._M_local_buf + 8),(string *)local_bf0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_46.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_46.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_bf0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_c30,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3d,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_47.field_2._M_local_buf + 8),(string *)local_c30);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_47.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_47.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_c30);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_c70,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3d,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_48.field_2._M_local_buf + 8),(string *)local_c70);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_48.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_48.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_c70);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_cb0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x29,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_49.field_2._M_local_buf + 8),(string *)local_cb0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_49.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_49.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_cb0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_cf0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x29,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_50.field_2._M_local_buf + 8),(string *)local_cf0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_50.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_50.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_cf0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_d30,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x36,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_51.field_2._M_local_buf + 8),(string *)local_d30);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_51.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_51.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_d30);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_d70,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x36,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_52.field_2._M_local_buf + 8),(string *)local_d70);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_52.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_52.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_d70);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_db0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3d,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_53.field_2._M_local_buf + 8),(string *)local_db0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_53.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_53.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_db0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_df0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3d,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_54.field_2._M_local_buf + 8),(string *)local_df0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_54.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_54.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_df0);
        if (*(int *)((anonymous_namespace)::s_floatTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                    ) != 3) {
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_e30,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2b,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_55.field_2._M_local_buf + 8),(string *)local_e30);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_55.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_55.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_e30);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_e70,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2b,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_56.field_2._M_local_buf + 8),(string *)local_e70);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_56.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_56.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_e70);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_eb0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x38,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_57.field_2._M_local_buf + 8),(string *)local_eb0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_57.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_57.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_eb0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_ef0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x38,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_58.field_2._M_local_buf + 8),(string *)local_ef0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_58.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_58.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_ef0);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_f30,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3f,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_59.field_2._M_local_buf + 8),(string *)local_f30);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_59.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_59.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_f30);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_f70,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3f,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_60.field_2._M_local_buf + 8),(string *)local_f70);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_60.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_60.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_f70);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_fb0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2b,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_61.field_2._M_local_buf + 8),(string *)local_fb0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_61.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_61.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_fb0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_ff0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2b,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_62.field_2._M_local_buf + 8),(string *)local_ff0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_62.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_62.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_ff0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1030,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x38,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_63.field_2._M_local_buf + 8),(string *)local_1030);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_63.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_63.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1030);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1070,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x38,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_64.field_2._M_local_buf + 8),(string *)local_1070);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_64.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_64.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1070);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_10b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3f,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_65.field_2._M_local_buf + 8),(string *)local_10b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_65.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_65.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_10b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_10f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3f,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_66.field_2._M_local_buf + 8),(string *)local_10f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_66.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_66.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_10f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1130,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2b,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_67.field_2._M_local_buf + 8),(string *)local_1130);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_67.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_67.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1130);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1170,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2b,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_68.field_2._M_local_buf + 8),(string *)local_1170);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_68.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_68.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1170);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_11b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x38,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_69.field_2._M_local_buf + 8),(string *)local_11b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_69.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_69.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_11b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_11f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x38,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_70.field_2._M_local_buf + 8),(string *)local_11f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_70.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_70.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_11f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1230,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3f,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_71.field_2._M_local_buf + 8),(string *)local_1230);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_71.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_71.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1230);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1270,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3f,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_72.field_2._M_local_buf + 8),(string *)local_1270);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_72.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_72.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1270);
        if (*(int *)((anonymous_namespace)::s_floatTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                    ) != 3) {
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_12b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2f,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_73.field_2._M_local_buf + 8),(string *)local_12b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_73.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_73.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_12b0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_12f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2f,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_74.field_2._M_local_buf + 8),(string *)local_12f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_74.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_74.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_12f0);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1330,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2f,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_75.field_2._M_local_buf + 8),(string *)local_1330);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_75.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_75.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1330);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1370,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2f,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_76.field_2._M_local_buf + 8),(string *)local_1370);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_76.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_76.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1370);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_13b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2f,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_77.field_2._M_local_buf + 8),(string *)local_13b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_77.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_77.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_13b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_13f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2f,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_78.field_2._M_local_buf + 8),(string *)local_13f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_78.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_78.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_13f0);
        if (*(int *)((anonymous_namespace)::s_floatTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                    ) != 4) {
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1430,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x30,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_79.field_2._M_local_buf + 8),(string *)local_1430);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_79.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_79.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1430);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1470,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x30,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_80.field_2._M_local_buf + 8),(string *)local_1470);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_80.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_80.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1470);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_14b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x30,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_81.field_2._M_local_buf + 8),(string *)local_14b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_81.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_81.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_14b0);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_14f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x30,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_82.field_2._M_local_buf + 8),(string *)local_14f0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_82.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_82.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_14f0);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1530,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x30,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_83.field_2._M_local_buf + 8),(string *)local_1530);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_83.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_83.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1530);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1570,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x30,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_84.field_2._M_local_buf + 8),(string *)local_1570);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_84.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_84.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1570);
        if (*(int *)((anonymous_namespace)::s_floatTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                    ) != 4) {
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_15b0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x32,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_85.field_2._M_local_buf + 8),(string *)local_15b0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_85.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_85.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_15b0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_15f0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x32,
                     *(DataType *)
                      ((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_86.field_2._M_local_buf + 8),(string *)local_15f0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_86.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_86.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_15f0);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1630,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x32,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_87.field_2._M_local_buf + 8),(string *)local_1630);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_87.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_87.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1630);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_1670,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x32,
                   *(DataType *)
                    ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4),
                   TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_88.field_2._M_local_buf + 8),(string *)local_1670);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_88.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_88.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_1670);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_16b0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x32,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,DVar5);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string
                  ((string *)(shaderSource_89.field_2._M_local_buf + 8),(string *)local_16b0);
        verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_89.field_2 + 8));
        std::__cxx11::string::~string((string *)(shaderSource_89.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_16b0);
        in_R9 = 1;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)local_16f0,(_anonymous_namespace_ *)local_10,
                   (NegativeTestContext *)
                   (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x32,
                   *(DataType *)
                    ((anonymous_namespace)::s_uintTypes + (long)(int)shaderSource.field_2._8_4_ * 4)
                   ,TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
        pNVar2 = local_10;
        SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
        std::__cxx11::string::string((string *)&local_1710,(string *)local_16f0);
        verifyShader(pNVar2,SVar1,&local_1710);
        std::__cxx11::string::~string((string *)&local_1710);
        std::__cxx11::string::~string((string *)local_16f0);
        pRVar4 = NegativeTestContext::getRenderContext(local_10);
        local_1714.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
        local_1718 = (deUint32)glu::ApiType::es(3,2);
        bVar3 = glu::contextSupports(local_1714,(ApiType)local_1718);
        pNVar2 = local_10;
        shaderSource_90.field_2._M_local_buf[0xf] = '\0';
        local_2819 = true;
        if (!bVar3) {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1738,(_anonymous_namespace_ *)0x2d,dataType);
          shaderSource_90.field_2._M_local_buf[0xf] = '\x01';
          local_2819 = NegativeTestContext::isExtensionSupported(pNVar2,&local_1738);
        }
        if ((shaderSource_90.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_1738);
        }
        DVar5 = (DataType)in_R9;
        if (local_2819 != false) {
          if (*(int *)((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 4) {
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_1760,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2d,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_91.field_2._M_local_buf + 8),(string *)local_1760);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_91.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_91.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1760);
            DVar5 = TYPE_FLOAT;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_17a0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2d,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                       (DataType)in_stack_ffffffffffffd518);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_92.field_2._M_local_buf + 8),(string *)local_17a0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_92.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_92.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_17a0);
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_17e0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3a,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_93.field_2._M_local_buf + 8),(string *)local_17e0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_93.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_93.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_17e0);
            DVar5 = TYPE_FLOAT;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_1820,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3a,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                       (DataType)in_stack_ffffffffffffd518);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_94.field_2._M_local_buf + 8),(string *)local_1820);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_94.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_94.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1820);
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_1860,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x41,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_95.field_2._M_local_buf + 8),(string *)local_1860);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_95.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_95.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1860);
            DVar5 = TYPE_FLOAT;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_18a0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x41,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                       (DataType)in_stack_ffffffffffffd518);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_96.field_2._M_local_buf + 8),(string *)local_18a0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_96.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_96.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_18a0);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_18e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2d,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_97.field_2._M_local_buf + 8),(string *)local_18e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_97.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_97.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_18e0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1920,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2d,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_98.field_2._M_local_buf + 8),(string *)local_1920);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_98.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_98.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1920);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1960,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3a,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_99.field_2._M_local_buf + 8),(string *)local_1960);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_99.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_99.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1960);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_19a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3a,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_100.field_2._M_local_buf + 8),(string *)local_19a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_100.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_100.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_19a0);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_19e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x41,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_101.field_2._M_local_buf + 8),(string *)local_19e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_101.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_101.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_19e0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1a20,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x41,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),TYPE_FLOAT,(DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_102.field_2._M_local_buf + 8),(string *)local_1a20);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_102.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_102.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1a20);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1a60,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2d,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_103.field_2._M_local_buf + 8),(string *)local_1a60);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_103.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_103.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1a60);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1aa0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x2d,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_104.field_2._M_local_buf + 8),(string *)local_1aa0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_104.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_104.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1aa0);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1ae0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3a,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_105.field_2._M_local_buf + 8),(string *)local_1ae0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_105.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_105.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1ae0);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1b20,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x3a,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_106.field_2._M_local_buf + 8),(string *)local_1b20);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_106.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_106.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1b20);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1b60,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x41,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_107.field_2._M_local_buf + 8),(string *)local_1b60);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_107.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_107.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1b60);
          in_R9 = 1;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1ba0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x41,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,
                     (DataType)in_stack_ffffffffffffd518);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_1bc0,(string *)local_1ba0);
          verifyShader(pNVar2,SVar1,&local_1bc0);
          std::__cxx11::string::~string((string *)&local_1bc0);
          std::__cxx11::string::~string((string *)local_1ba0);
        }
        pRVar4 = NegativeTestContext::getRenderContext(local_10);
        local_1bc4.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
        local_1bc8 = (deUint32)glu::ApiType::es(3,2);
        bVar3 = glu::contextSupports(local_1bc4,(ApiType)local_1bc8);
        pNVar2 = local_10;
        shaderSource_108.field_2._M_local_buf[0xf] = '\0';
        local_2a71 = true;
        if (!bVar3) {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1be8,(_anonymous_namespace_ *)0x33,dataType_00);
          shaderSource_108.field_2._M_local_buf[0xf] = '\x01';
          local_2a71 = NegativeTestContext::isExtensionSupported(pNVar2,&local_1be8);
        }
        if ((shaderSource_108.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_1be8);
        }
        DVar5 = (DataType)in_stack_ffffffffffffd518;
        if (local_2a71 != false) {
          if (*(int *)((anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 4) {
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)local_1c10,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x33,
                       *(DataType *)
                        ((anonymous_namespace)::s_floatTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,DVar5);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_109.field_2._M_local_buf + 8),(string *)local_1c10);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_109.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_109.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1c10);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1c50,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x33,
                     *(DataType *)
                      ((anonymous_namespace)::s_intTypes + (long)(int)shaderSource.field_2._8_4_ * 4
                      ),TYPE_FLOAT,DVar5);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)((anonymous_namespace)::s_shaders + (long)local_48 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_110.field_2._M_local_buf + 8),(string *)local_1c50);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_110.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_110.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1c50);
          in_stack_ffffffffffffd518 = (anonymous_namespace)::s_shaders;
          in_R9 = 1;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)local_1c90,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)((anonymous_namespace)::s_shaders + (long)local_48 * 4),0x33,
                     *(DataType *)
                      ((anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_FLOAT,0xf65050);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)(in_stack_ffffffffffffd518 + (long)local_48 * 4);
          std::__cxx11::string::string((string *)&local_1cb0,(string *)local_1c90);
          verifyShader(pNVar2,SVar1,&local_1cb0);
          std::__cxx11::string::~string((string *)&local_1cb0);
          std::__cxx11::string::~string((string *)local_1c90);
        }
      }
      NegativeTestContext::endSection(local_10);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void texture_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid P type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC2)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}